

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O3

int main(void)

{
  int *piVar1;
  ostream *poVar2;
  iterator iVar3;
  int *prime;
  long lVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int *__src;
  int *piVar9;
  int *piVar10;
  bool bVar11;
  int n;
  vector<int,_std::allocator<int>_> primes;
  int local_60;
  int local_5c;
  int *local_58;
  iterator iStack_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_58 = (int *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  local_5c = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter amount of primes to find:\n",0x20);
  std::istream::operator>>((istream *)&std::cin,&local_5c);
  local_60 = 2;
  if (0 < local_5c) {
    do {
      if (iStack_50._M_current == local_48) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_60);
      }
      else {
        *iStack_50._M_current = local_60;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_60 = local_60 + 1;
    } while (SBORROW4(local_60,local_5c * 10) != local_60 + local_5c * -10 < 0);
  }
  if (local_58 != iStack_50._M_current) {
    piVar5 = local_58 + -1;
    lVar8 = -(long)local_58;
    iVar3._M_current = iStack_50._M_current;
    piVar9 = local_58;
    piVar7 = local_58;
    do {
      piVar7 = piVar7 + 1;
      lVar8 = lVar8 + -4;
      piVar10 = piVar9 + 1;
      lVar4 = lVar8;
      __src = piVar7;
      local_40 = piVar9;
      local_38 = piVar5;
      do {
        if ((piVar5[1] != *piVar10) && (piVar5[1] % *piVar10 == 0)) {
          if (__src != iVar3._M_current) {
            memmove(__src + -1,__src,(long)iVar3._M_current + lVar4);
            iVar3._M_current = iStack_50._M_current;
          }
          iVar3._M_current = iVar3._M_current + -1;
          iStack_50._M_current = iVar3._M_current;
        }
        piVar1 = local_40;
        piVar5 = piVar5 + 1;
        __src = __src + 1;
        lVar4 = lVar4 + -4;
      } while (piVar5 != iVar3._M_current);
      piVar5 = local_38 + 1;
      piVar9 = piVar10;
    } while (piVar10 != iVar3._M_current);
    if (local_58 != piVar10) {
      iVar6 = 0;
      piVar5 = local_58;
      do {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
        local_60 = CONCAT31(local_60._1_3_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_60,1);
        if (iVar6 == local_5c) break;
        iVar6 = iVar6 + 1;
        bVar11 = piVar5 != piVar1;
        piVar5 = piVar5 + 1;
      } while (bVar11);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if (local_58 != (int *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return 0;
}

Assistant:

int main()
{
	std::vector<int> primes;
	auto n = 0;
	std::cout << "Enter amount of primes to find:\n";
	std::cin >> n;
	for (auto i = 2; i < n * 10; ++i)
		primes.push_back(i);

	for (auto it = primes.begin(); it != primes.end();)
	{
		auto next = it++;
		for (;;)
		{
			if (*next != *it && *next % *it == 0)
				primes.erase(next);
			if (next == primes.end())
				break;
			++next;
		}
	}

	auto cnt = 0;
	for (auto&& prime : primes)
	{
		std::cout << prime << ' ';
		if (cnt == n)
			break;
		++cnt;
	}
	std::cout << std::endl;
	return 0;
}